

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

bool __thiscall BenevolentBotStrategy::canFortify(BenevolentBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  Country *pCVar2;
  pointer ppCVar3;
  bool bVar4;
  bool bVar5;
  Country *pCVar6;
  Country *pCVar7;
  pointer ppCVar8;
  pointer ppCVar9;
  
  pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  ppCVar8 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  bVar4 = false;
  bVar5 = false;
  pCVar6 = (Country *)0x0;
  do {
    pCVar2 = *ppCVar8;
    pCVar7 = pCVar2;
    if ((pCVar6 != (Country *)0x0) &&
       (pCVar7 = pCVar6, *pCVar2->pNumberOfTroops < *pCVar6->pNumberOfTroops)) {
      ppCVar9 = (pCVar2->pAdjCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar3 = (pCVar2->pAdjCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar9 != ppCVar3) {
        do {
          if ((*(*ppCVar9)->pPlayerOwnerId == *pCVar2->pPlayerOwnerId) &&
             (bVar5 = bVar4, *pCVar2->pNumberOfTroops < *(*ppCVar9)->pNumberOfTroops)) {
            bVar4 = true;
            pCVar6 = pCVar2;
            bVar5 = true;
          }
          ppCVar9 = ppCVar9 + 1;
          pCVar7 = pCVar6;
        } while (ppCVar9 != ppCVar3);
      }
    }
    ppCVar8 = ppCVar8 + 1;
    pCVar6 = pCVar7;
  } while (ppCVar8 !=
           (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
           super__Vector_impl_data._M_finish);
  ppCVar8 = (pCVar7->pAdjCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar9 = (pCVar7->pAdjCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar8 != ppCVar9) {
    do {
      if ((*(*ppCVar8)->pPlayerOwnerId == *pCVar7->pPlayerOwnerId) &&
         (*pCVar7->pNumberOfTroops < *(*ppCVar8)->pNumberOfTroops)) {
        bVar5 = true;
      }
      ppCVar8 = ppCVar8 + 1;
    } while (ppCVar8 != ppCVar9);
  }
  return bVar5;
}

Assistant:

bool BenevolentBotStrategy::canFortify() {
    bool canFortify = false;
    Map::Country* smallestCountry = nullptr;

    for (auto* country: *player->getOwnedCountries()) {
        if (smallestCountry == nullptr) {
            smallestCountry = country;
        } else if (smallestCountry->getNumberOfTroops() > country->getNumberOfTroops()) {
            for (auto* neighbour : *country->getAdjCountries()) {
                if (neighbour->getPlayerOwnerID() == country->getPlayerOwnerID()
                    && neighbour->getNumberOfTroops() > country->getNumberOfTroops()) {
                    smallestCountry = country;
                    canFortify = true;
                }
            }
        }
    }

    for (auto* neighbour : *smallestCountry->getAdjCountries()) {
        if (neighbour->getPlayerOwnerID() == smallestCountry->getPlayerOwnerID()
                && neighbour->getNumberOfTroops() > smallestCountry->getNumberOfTroops()) {
            canFortify = true;
        }
    }
    return canFortify;
}